

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O0

exr_result_t internal_exr_apply_zip(exr_encode_pipeline_t *encode)

{
  long lVar1;
  exr_result_t eVar2;
  long in_RDI;
  _internal_exr_context *pctxt;
  size_t *in_stack_00000010;
  exr_result_t rv;
  exr_transcoding_pipeline_buffer_id_t in_stack_00000024;
  exr_encode_pipeline_t *in_stack_00000028;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar2 = internal_encode_alloc_buffer
                    (in_stack_00000028,in_stack_00000024,&encode->channels,in_stack_00000010,
                     (size_t)pctxt);
  if (eVar2 == 0) {
    eVar2 = apply_zip_impl((exr_encode_pipeline_t *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x10);
    if (lVar1 != 0) {
      (**(code **)(lVar1 + 0x48))
                (lVar1,eVar2,"Unable to allocate scratch buffer for deflate of %llu bytes",
                 *(undefined8 *)(in_RDI + 0x68));
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
internal_exr_apply_zip (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        encode->packed_bytes);
    if (rv != EXR_ERR_SUCCESS)
    {
        const struct _internal_exr_context* pctxt = EXR_CCTXT (encode->context);
        if (pctxt)
            pctxt->print_error (
                pctxt,
                rv,
                "Unable to allocate scratch buffer for deflate of %llu bytes",
                encode->packed_bytes);
        return rv;
    }

    return apply_zip_impl (encode);
}